

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O0

void __thiscall bsplib::Rdma::PushPopCommBuf::deserialize(PushPopCommBuf *this,A2A *a2a)

{
  value_type vVar1;
  size_type __new_size;
  char *pcVar2;
  int iVar3;
  int iVar4;
  exception *peVar5;
  exception *peVar6;
  long lVar7;
  reference pvVar8;
  Memslot MVar9;
  Memslot MVar10;
  reference pvVar11;
  Memslot MVar12;
  exception local_5a0;
  Memslot local_400;
  Memslot slotid;
  size_t s_1;
  exception local_3e8;
  Memslot local_248;
  size_type local_240;
  size_t n_1;
  size_type sStack_230;
  int p_1;
  size_t n_popped_slots;
  PushEntry entry;
  size_t id;
  size_t size;
  size_t addr;
  char *null;
  size_t s;
  exception local_1d0;
  char *local_30;
  size_t n;
  char *pcStack_20;
  int p;
  size_t n_pushed_slots;
  A2A *a2a_local;
  PushPopCommBuf *this_local;
  
  pcStack_20 = (char *)0x0;
  n._4_4_ = 0;
  n_pushed_slots = (size_t)a2a;
  a2a_local = (A2A *)this;
  do {
    iVar4 = n._4_4_;
    iVar3 = A2A::nprocs((A2A *)n_pushed_slots);
    if (iVar3 <= iVar4) {
      sStack_230 = 0xffffffffffffffff;
      n_1._4_4_ = 0;
      do {
        iVar4 = n_1._4_4_;
        iVar3 = A2A::nprocs((A2A *)n_pushed_slots);
        if (iVar3 <= iVar4) {
          return;
        }
        deserial<unsigned_long>((A2A *)n_pushed_slots,n_1._4_4_,&local_240);
        __new_size = local_240;
        if (n_1._4_4_ == 0) {
          sStack_230 = local_240;
          local_248 = no_slot();
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                    (&this->m_popped_slots,__new_size,&local_248);
        }
        else if (local_240 != sStack_230) {
          s_1._7_1_ = 1;
          peVar5 = (exception *)__cxa_allocate_exception(0x1a0);
          exception::exception(&local_3e8,"bsp_pop_reg");
          peVar6 = exception::operator<<
                             (&local_3e8,
                              (char (*) [94])
                              "Not all processes popped the same number of memory blocks. For example, process 0 registered "
                             );
          peVar6 = exception::operator<<(peVar6,&stack0xfffffffffffffdd0);
          peVar6 = exception::operator<<(peVar6,(char (*) [24])" blocks, while process ");
          peVar6 = exception::operator<<(peVar6,(int *)((long)&n_1 + 4));
          peVar6 = exception::operator<<(peVar6,(char (*) [12])" registerd ");
          peVar6 = exception::operator<<(peVar6,&local_240);
          exception::exception(peVar5,peVar6);
          s_1._7_1_ = 0;
          __cxa_throw(peVar5,&exception::typeinfo,exception::~exception);
        }
        for (slotid = 0; slotid < sStack_230; slotid = slotid + 1) {
          local_400 = no_slot();
          deserial<unsigned_long>((A2A *)n_pushed_slots,n_1._4_4_,&local_400);
          MVar10 = local_400;
          MVar9 = no_slot();
          MVar12 = local_400;
          if (MVar10 == MVar9) {
            __assert_fail("slotid != no_slot()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/rdma.cc"
                          ,0x1cf,"void bsplib::Rdma::PushPopCommBuf::deserialize(A2A &)");
          }
          MVar10 = null_slot();
          if (MVar12 != MVar10) {
            pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (&this->m_popped_slots,slotid);
            vVar1 = *pvVar11;
            MVar12 = no_slot();
            MVar10 = local_400;
            if (vVar1 == MVar12) {
              pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                  (&this->m_popped_slots,slotid);
              *pvVar11 = MVar10;
            }
            else {
              pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                  (&this->m_popped_slots,slotid);
              if (*pvVar11 != local_400) {
                peVar5 = (exception *)__cxa_allocate_exception(0x1a0);
                exception::exception(&local_5a0,"bsp_pop_reg");
                peVar6 = exception::operator<<(&local_5a0,(char (*) [17])"Processes 0 and ");
                peVar6 = exception::operator<<(peVar6,(int *)((long)&n_1 + 4));
                peVar6 = exception::operator<<
                                   (peVar6,(char (*) [42])
                                           " did not pop the same memory registration");
                exception::exception(peVar5,peVar6);
                __cxa_throw(peVar5,&exception::typeinfo,exception::~exception);
              }
            }
          }
        }
        n_1._4_4_ = n_1._4_4_ + 1;
      } while( true );
    }
    deserial<unsigned_long>((A2A *)n_pushed_slots,n._4_4_,(unsigned_long *)&local_30);
    if (n._4_4_ == 0) {
      pcStack_20 = local_30;
      iVar4 = A2A::nprocs((A2A *)n_pushed_slots);
      std::
      vector<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
      ::resize(&this->m_pushed_slots,(long)iVar4 * (long)local_30);
    }
    else if (local_30 != pcStack_20) {
      s._3_1_ = 1;
      peVar5 = (exception *)__cxa_allocate_exception(0x1a0);
      exception::exception(&local_1d0,"bsp_push_reg");
      peVar6 = exception::operator<<
                         (&local_1d0,
                          (char (*) [98])
                          "Not all processes registered the same number of memory blocks. For example, process 0 registered "
                         );
      peVar6 = exception::operator<<(peVar6,(unsigned_long *)&stack0xffffffffffffffe0);
      peVar6 = exception::operator<<(peVar6,(char (*) [24])" blocks, while process ");
      peVar6 = exception::operator<<(peVar6,(int *)((long)&n + 4));
      peVar6 = exception::operator<<(peVar6,(char (*) [12])" registerd ");
      peVar6 = exception::operator<<(peVar6,(unsigned_long *)&local_30);
      exception::exception(peVar5,peVar6);
      s._3_1_ = 0;
      __cxa_throw(peVar5,&exception::typeinfo,exception::~exception);
    }
    for (null = (char *)0x0; null < pcStack_20; null = null + 1) {
      addr = 0;
      deserial<unsigned_long>((A2A *)n_pushed_slots,n._4_4_,&size);
      deserial<unsigned_long>((A2A *)n_pushed_slots,n._4_4_,&id);
      deserial<unsigned_long>((A2A *)n_pushed_slots,n._4_4_,&entry.slot);
      pcVar2 = null;
      n_popped_slots = addr + size;
      entry.block.addr = (void *)id;
      entry.block.size._0_4_ = 0;
      entry.block._16_8_ = entry.slot;
      lVar7 = (long)n._4_4_;
      iVar4 = A2A::nprocs((A2A *)n_pushed_slots);
      pvVar8 = std::
               vector<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
               ::operator[](&this->m_pushed_slots,lVar7 + (long)pcVar2 * (long)iVar4);
      (pvVar8->block).addr = (void *)n_popped_slots;
      (pvVar8->block).size = (size_t)entry.block.addr;
      *(ulong *)&(pvVar8->block).status =
           CONCAT44(entry.block.size._4_4_,(undefined4)entry.block.size);
      pvVar8->slot = entry.block._16_8_;
    }
    n._4_4_ = n._4_4_ + 1;
  } while( true );
}

Assistant:

void Rdma::PushPopCommBuf::deserialize( A2A & a2a ) 
{
    size_t n_pushed_slots = 0;

    // read pushed slots
    for (int p = 0; p < a2a.nprocs(); ++p) {
        size_t n;
        deserial( a2a, p, n );

        if ( p == 0 ) {
            n_pushed_slots = n;
            m_pushed_slots.resize( a2a.nprocs() * n );
        } else if (n != n_pushed_slots )
            throw exception("bsp_push_reg") <<
                "Not all processes registered the same number of memory "
                "blocks. For example, process 0 registered " << n_pushed_slots
                << " blocks, while process " << p << " registerd " << n;

        for (size_t s = 0; s < n_pushed_slots; ++s) {
            char * null = NULL;
            size_t addr, size, id;
            deserial( a2a, p, addr);
            deserial( a2a, p, size);
            deserial( a2a, p, id );

            PushEntry entry = { { null + addr, size, Memblock::NORMAL }, id };
            m_pushed_slots[ p + s * a2a.nprocs() ] = entry ;
        }
    }

    // read popped slots
    size_t n_popped_slots = size_t(-1);
    for (int p = 0; p < a2a.nprocs(); ++p) {
        size_t n;
        deserial( a2a, p, n );

        if ( p == 0 ) {
            n_popped_slots = n;
            m_popped_slots.resize( n, no_slot() );
        } else if (n != n_popped_slots )
            throw exception("bsp_pop_reg") <<
                "Not all processes popped the same number of memory "
                "blocks. For example, process 0 registered " << n_popped_slots
                << " blocks, while process " << p << " registerd " << n;

        for (size_t s = 0; s < n_popped_slots; ++s) {
            Memslot slotid = no_slot();
            deserial( a2a, p, slotid );
            assert( slotid != no_slot() );

            if ( slotid != null_slot() ) {
                if ( m_popped_slots[s] == no_slot() ) {
                    m_popped_slots[s] = slotid;
                }
                else {
                    if (m_popped_slots[s] != slotid ) {
                        throw exception("bsp_pop_reg") <<
                            "Processes 0 and " << p << " did not pop "
                            "the same memory registration";
                    }
                }
            }
        }
    }
    
}